

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall duckdb::StringValueScanner::SetStart(StringValueScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *psVar1;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  idx_t iVar2;
  ulong uVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  idx_t iVar5;
  idx_t iVar6;
  undefined1 auVar7 [8];
  _Alloc_hider _Var8;
  bool bVar9;
  CSVBufferHandle *pCVar10;
  CSVBufferManager *pCVar11;
  CSVStateMachineCache *this_02;
  CSVStateMachine *pCVar12;
  StateMachine *__args;
  byte bVar13;
  undefined8 uVar14;
  CSVStateMachine *__tmp;
  ValidRowInfo quoted_row;
  ValidRowInfo best_row;
  undefined1 local_91;
  ValidRowInfo local_90;
  undefined1 local_68 [8];
  _Alloc_hider _Stack_60;
  idx_t local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  undefined8 local_40;
  CSVOption<bool> local_38;
  
  iVar2 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  this->start_pos =
       (this->super_BaseScanner).iterator.pos.buffer_idx *
       (this->super_BaseScanner).iterator.buffer_size + iVar2;
  if ((this->super_BaseScanner).iterator.first_one == true) {
    if ((this->result).store_line_size != true) {
      return;
    }
    CSVErrorHandler::NewMaxLineSize((this->result).error_handler,iVar2);
    return;
  }
  uVar3 = (this->super_BaseScanner).iterator.boundary.end_pos;
  this_00 = &(this->super_BaseScanner).cur_buffer_handle;
  pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
  if (pCVar10->actual_size < uVar3) {
    pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    (this->super_BaseScanner).iterator.boundary.end_pos = pCVar10->actual_size;
  }
  if ((this->state_machine_strict).internal.
      super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pCVar11 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                        (&(this->super_BaseScanner).buffer_manager);
    this_02 = CSVStateMachineCache::Get(pCVar11->context);
    psVar1 = &(this->super_BaseScanner).state_machine;
    pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
    local_68[0] = (pCVar12->state_machine_options).delimiter.set_by_user;
    pcVar4 = (pCVar12->state_machine_options).delimiter.value._M_dataplus._M_p;
    _Stack_60._M_p = (pointer)&aStack_50;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_60,pcVar4,
               pcVar4 + (pCVar12->state_machine_options).delimiter.value._M_string_length);
    local_38 = (pCVar12->state_machine_options).strict_mode;
    local_40._0_2_ = (pCVar12->state_machine_options).quote;
    local_40._2_2_ = (pCVar12->state_machine_options).escape;
    local_40._4_2_ = (pCVar12->state_machine_options).comment;
    local_40._6_2_ = (pCVar12->state_machine_options).new_line;
    if (((ushort)local_38 & 1) == 0) {
      local_38.set_by_user = false;
      local_38.value = true;
    }
    __args = CSVStateMachineCache::Get(this_02,(CSVStateMachineOptions *)local_68);
    pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
    local_90._0_8_ = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::CSVStateMachine,std::allocator<duckdb::CSVStateMachine>,duckdb::StateMachine_const&,duckdb::CSVReaderOptions_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90.start_pos,
               (CSVStateMachine **)&local_90,(allocator<duckdb::CSVStateMachine> *)&local_91,__args,
               pCVar12->options);
    iVar2 = local_90.start_pos;
    uVar14 = local_90._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.start_pos !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_90.start_pos + 8) = *(int *)(local_90.start_pos + 8) + 1;
        UNLOCK();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.start_pos ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_017df1bd;
      }
      else {
        *(int *)(local_90.start_pos + 8) = *(int *)(local_90.start_pos + 8) + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.start_pos);
    }
LAB_017df1bd:
    (this->state_machine_strict).internal.
    super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar14;
    this_01 = (this->state_machine_strict).internal.
              super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->state_machine_strict).internal.
    super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar2;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_60._M_p != &aStack_50) {
      operator_delete(_Stack_60._M_p);
    }
  }
  TryRow((ValidRowInfo *)local_68,this,STANDARD_NEWLINE,
         (this->super_BaseScanner).iterator.pos.buffer_pos,
         (this->super_BaseScanner).iterator.boundary.end_pos);
  psVar1 = &(this->super_BaseScanner).state_machine;
  pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
  bVar13 = local_68[0];
  if ((pCVar12->dialect_options).state_machine_options.quote.value != '\0') {
    uVar14 = (this->super_BaseScanner).iterator.boundary.end_pos;
    if (((ulong)local_68 & 1) == 0) {
      TryRow(&local_90,this,QUOTED,(this->super_BaseScanner).iterator.pos.buffer_pos,uVar14);
      if (local_90.is_valid == false) goto LAB_017df2b2;
LAB_017df28d:
      local_68 = (undefined1  [8])local_90._0_8_;
      auVar7 = local_68;
      _Stack_60._M_p = (pointer)local_90.start_pos;
      aStack_50._M_local_buf[8] = local_90.last_state_quote;
      local_58 = local_90.end_buffer_idx;
      aStack_50._M_allocated_capacity = local_90.end_pos;
      bVar9 = true;
      local_68[0] = local_90.is_valid;
      bVar13 = local_68[0];
      local_68 = auVar7;
    }
    else {
      if (local_58 == (this->super_BaseScanner).iterator.pos.buffer_idx) {
        uVar14 = aStack_50._M_allocated_capacity;
      }
      TryRow(&local_90,this,QUOTED,(this->super_BaseScanner).iterator.pos.buffer_pos,uVar14);
      if (local_90.is_valid == false) {
LAB_017df2b2:
        bVar9 = false;
      }
      else {
        bVar9 = true;
        if (aStack_50._M_local_buf[8] == '\x01') goto LAB_017df28d;
      }
    }
    if ((bVar13 & 1) == 0) {
      if (bVar9) goto LAB_017df2c8;
      if (local_90.start_pos <= _Stack_60._M_p) goto LAB_017df2f0;
LAB_017df2d4:
      aStack_50._M_local_buf[8] = local_90.last_state_quote;
      local_58 = local_90.end_buffer_idx;
      aStack_50._M_allocated_capacity = local_90.end_pos;
      local_68 = (undefined1  [8])local_90._0_8_;
      _Stack_60._M_p = (pointer)local_90.start_pos;
    }
    else if (bVar9) {
LAB_017df2c8:
      if (local_90.start_pos < _Stack_60._M_p) goto LAB_017df2d4;
    }
LAB_017df2f0:
    bVar13 = local_68[0];
  }
  if ((((bVar13 & 1) == 0) &&
      (pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1),
      (pCVar12->dialect_options).state_machine_options.escape.value != '\0')) &&
     (pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1),
     (pCVar12->dialect_options).state_machine_options.quote.value != '\0')) {
    TryRow(&local_90,this,ESCAPE,(this->super_BaseScanner).iterator.pos.buffer_pos,
           (this->super_BaseScanner).iterator.boundary.end_pos);
    if ((local_90.is_valid != false) || (_Stack_60._M_p < local_90.start_pos)) {
      aStack_50._M_local_buf[8] = local_90.last_state_quote;
      local_58 = local_90.end_buffer_idx;
      aStack_50._M_allocated_capacity = local_90.end_pos;
      local_68 = (undefined1  [8])local_90._0_8_;
      _Stack_60._M_p = (pointer)local_90.start_pos;
    }
    bVar13 = local_68[0];
  }
  _Var8._M_p = _Stack_60._M_p;
  if ((bVar13 & 1) == 0) {
    pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    if ((_Var8._M_p <
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pCVar10->actual_size) ||
       (pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00),
       pCVar10->is_last_buffer != true)) {
      bVar9 = SkipUntilState(this,STANDARD_NEWLINE,RECORD_SEPARATOR,
                             &(this->super_BaseScanner).iterator,&local_90.is_valid);
      if (((bVar9) || ((this->super_BaseScanner).iterator.is_set != true)) ||
         (((this->super_BaseScanner).iterator.pos.buffer_idx <=
           (this->super_BaseScanner).iterator.boundary.buffer_idx &&
          ((this->super_BaseScanner).iterator.pos.buffer_pos <=
           (this->super_BaseScanner).iterator.boundary.buffer_pos)))) goto LAB_017df3fc;
    }
    else {
      (this->super_BaseScanner).iterator.pos.buffer_pos = (idx_t)_Var8._M_p;
    }
  }
  else {
    (this->super_BaseScanner).iterator.pos.buffer_pos = (idx_t)_Stack_60._M_p;
    pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    if ((_Var8._M_p <
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pCVar10->actual_size) ||
       (pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00),
       pCVar10->is_last_buffer != true)) goto LAB_017df3fc;
  }
  (this->super_BaseScanner).iterator.done = true;
LAB_017df3fc:
  iVar2 = (this->super_BaseScanner).iterator.pos.buffer_idx;
  iVar5 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  iVar6 = (this->result).buffer_size;
  (this->result).super_ScannerResult.last_position.buffer_pos = iVar5;
  (this->result).super_ScannerResult.last_position.buffer_size = iVar6;
  (this->result).super_ScannerResult.last_position.buffer_idx = iVar2;
  this->start_pos = iVar2 * (this->super_BaseScanner).iterator.buffer_size + iVar5;
  return;
}

Assistant:

void StringValueScanner::SetStart() {
	start_pos = iterator.GetGlobalCurrentPos();
	if (iterator.first_one) {
		if (result.store_line_size) {
			result.error_handler.NewMaxLineSize(iterator.pos.buffer_pos);
		}
		return;
	}
	if (iterator.GetEndPos() > cur_buffer_handle->actual_size) {
		iterator.SetEnd(cur_buffer_handle->actual_size);
	}
	if (!state_machine_strict) {
		// We need to initialize our strict state machine
		auto &state_machine_cache = CSVStateMachineCache::Get(buffer_manager->context);
		auto state_options = state_machine->state_machine_options;
		// To set the state machine to be strict we ensure that strict_mode is set to true
		if (!state_options.strict_mode.IsSetByUser()) {
			state_options.strict_mode = true;
		}
		state_machine_strict =
		    make_shared_ptr<CSVStateMachine>(state_machine_cache.Get(state_options), state_machine->options);
	}
	// At this point we have 3 options:
	// 1. We are at the start of a valid line
	ValidRowInfo best_row = TryRow(CSVState::STANDARD_NEWLINE, iterator.pos.buffer_pos, iterator.GetEndPos());
	// 2. We are in the middle of a quoted value
	if (state_machine->dialect_options.state_machine_options.quote.GetValue() != '\0') {
		idx_t end_pos = iterator.GetEndPos();
		if (best_row.is_valid && best_row.end_buffer_idx == iterator.pos.buffer_idx) {
			// If we got a valid row from the standard state, we limit our search up to that.
			end_pos = best_row.end_pos;
		}
		auto quoted_row = TryRow(CSVState::QUOTED, iterator.pos.buffer_pos, end_pos);
		if (quoted_row.is_valid && (!best_row.is_valid || best_row.last_state_quote)) {
			best_row = quoted_row;
		}
		if (!best_row.is_valid && !quoted_row.is_valid && best_row.start_pos < quoted_row.start_pos) {
			best_row = quoted_row;
		}
		if (quoted_row.is_valid && quoted_row.start_pos < best_row.start_pos) {
			best_row = quoted_row;
		}
	}
	// 3. We are in an escaped value
	if (!best_row.is_valid && state_machine->dialect_options.state_machine_options.escape.GetValue() != '\0' &&
	    state_machine->dialect_options.state_machine_options.quote.GetValue() != '\0') {
		auto escape_row = TryRow(CSVState::ESCAPE, iterator.pos.buffer_pos, iterator.GetEndPos());
		if (escape_row.is_valid) {
			best_row = escape_row;
		} else {
			if (best_row.start_pos < escape_row.start_pos) {
				best_row = escape_row;
			}
		}
	}
	if (!best_row.is_valid) {
		bool is_this_the_end =
		    best_row.start_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer;
		if (is_this_the_end) {
			iterator.pos.buffer_pos = best_row.start_pos;
			iterator.done = true;
		} else {
			bool mock;
			if (!SkipUntilState(CSVState::STANDARD_NEWLINE, CSVState::RECORD_SEPARATOR, iterator, mock)) {
				iterator.CheckIfDone();
			}
		}
	} else {
		iterator.pos.buffer_pos = best_row.start_pos;
		bool is_this_the_end =
		    best_row.start_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer;
		if (is_this_the_end) {
			iterator.done = true;
		}
	}

	// 4. We have an error, if we have an error, we let life go on, the scanner will either ignore it
	// or throw.
	result.last_position = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, result.buffer_size};
	start_pos = iterator.GetGlobalCurrentPos();
}